

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase583::run(TestCase583 *this)

{
  ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_> *this_00;
  _func_int **pp_Var1;
  long lVar2;
  SourceLocation location;
  long lVar3;
  __pid_t _Var4;
  void *pvVar5;
  PromiseBase PVar6;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:597:40),_kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>_>
  branch2;
  __pid_t local_180;
  undefined4 uStack_17c;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:593:40),_kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>_>
  branch1;
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
  releaseFork;
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_> fork
  ;
  Promise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_> promise;
  Own<kj::_::ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>,_std::nullptr_t>
  local_138;
  WaitScope waitScope;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  yield();
  pp_Var1 = fork.hub.disposer[1]._vptr_Disposer;
  if (pp_Var1 == (_func_int **)0x0 || (ulong)((long)fork.hub.disposer - (long)pp_Var1) < 0x28) {
    pvVar5 = operator_new(0x400);
    PVar6.node.ptr = (OwnPromiseNode)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&fork,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:587:58)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00578fe8;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    fork.hub.disposer[1]._vptr_Disposer = (_func_int **)0x0;
    PVar6.node.ptr = (OwnPromiseNode)(fork.hub.disposer + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&fork,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:587:58)>
               ::anon_class_1_0_00000001_for_func::operator());
    fork.hub.disposer[-5]._vptr_Disposer = (_func_int **)&PTR_destroy_00578fe8;
    fork.hub.disposer[-4]._vptr_Disposer = pp_Var1;
  }
  releaseFork.hub.disposer = (Disposer *)0x0;
  local_138.disposer = (Disposer *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar6.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_138);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&releaseFork);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&fork);
  releaseFork.hub.disposer = (Disposer *)anon_var_dwarf_4f636;
  releaseFork.hub.ptr =
       (ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_> *)
       0x3d740e;
  pvVar5 = operator_new(0x400);
  this_00 = (ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
             *)((long)pvVar5 + 0x1d8);
  *(undefined ***)((long)pvVar5 + 0x1d8) = &PTR_destroy_00579040;
  *(undefined ***)((long)pvVar5 + 0x1e8) = &PTR_traceEvent_00579068;
  location.function = (char *)releaseFork.hub.ptr;
  location.fileName = (char *)releaseFork.hub.disposer;
  location.lineNumber = 0x24f;
  location.columnNumber = 0xf;
  kj::_::ForkHubBase::ForkHubBase
            ((ForkHubBase *)this_00,(OwnPromiseNode *)&promise,
             (ExceptionOrValue *)((long)pvVar5 + 0x250),location);
  *(undefined ***)((long)pvVar5 + 0x1d8) = &PTR_destroy_00579040;
  *(undefined ***)((long)pvVar5 + 0x1e8) = &PTR_traceEvent_00579068;
  *(undefined1 *)((long)pvVar5 + 0x250) = 0;
  *(undefined1 *)((long)pvVar5 + 1000) = 0;
  *(void **)((long)pvVar5 + 0x1e0) = pvVar5;
  local_138.disposer =
       (Disposer *)
       &kj::_::
        StaticDisposerAdapter<kj::_::ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,decltype(nullptr)>>>,kj::_::ForkHubBase>
        ::instance;
  branch1.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  fork.hub.disposer =
       (Disposer *)
       &kj::_::
        StaticDisposerAdapter<kj::_::ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,decltype(nullptr)>>>,kj::_::ForkHubBase>
        ::instance;
  local_138.ptr =
       (ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_> *)
       0x0;
  fork.hub.ptr = this_00;
  Own<kj::_::ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>,_std::nullptr_t>
  ::~Own(&local_138);
  Own<kj::_::ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>,_kj::_::ForkHubBase>
  ::~Own((Own<kj::_::ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>,_kj::_::ForkHubBase>
          *)&branch1);
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>::
  addBranch((ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
             *)&branch2);
  lVar2 = *(long *)((long)branch2.super_PromiseBase.node.ptr + 8);
  if (lVar2 == 0 || (ulong)((long)branch2.super_PromiseBase.node.ptr - lVar2) < 0x28) {
    pvVar5 = operator_new(0x400);
    PVar6.node.ptr = (OwnPromiseNode)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&branch2,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:593:40)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00579128;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    *(undefined8 *)((long)branch2.super_PromiseBase.node.ptr + 8) = 0;
    PVar6.node.ptr = (OwnPromiseNode)((long)branch2.super_PromiseBase.node.ptr + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&branch2,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:593:40)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)branch2.super_PromiseBase.node.ptr + -0x28) = &PTR_destroy_00579128;
    *(long *)((long)branch2.super_PromiseBase.node.ptr + -0x20) = lVar2;
  }
  releaseFork.hub.disposer = (Disposer *)0x0;
  local_138.disposer = (Disposer *)0x0;
  branch1.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar6.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_138);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&releaseFork);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&branch2);
  ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>::
  addBranch((ForkedPromise<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
             *)&stack0xfffffffffffffe80);
  lVar3 = CONCAT44(uStack_17c,local_180);
  lVar2 = *(long *)(lVar3 + 8);
  if (lVar2 == 0 || (ulong)(lVar3 - lVar2) < 0x28) {
    pvVar5 = operator_new(0x400);
    PVar6.node.ptr = (OwnPromiseNode)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&stack0xfffffffffffffe80
               ,kj::_::
                SimpleTransformPromiseNode<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:597:40)>
                ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00579180;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    *(undefined8 *)(lVar3 + 8) = 0;
    PVar6.node.ptr = (OwnPromiseNode)(lVar3 + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&stack0xfffffffffffffe80
               ,kj::_::
                SimpleTransformPromiseNode<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:597:40)>
                ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)(lVar3 + -0x28) = &PTR_destroy_00579180;
    *(long *)(lVar3 + -0x20) = lVar2;
  }
  releaseFork.hub.disposer = (Disposer *)0x0;
  local_138.disposer = (Disposer *)0x0;
  branch2.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar6.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_138);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&releaseFork);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffe80);
  releaseFork.hub.disposer =
       (Disposer *)
       &kj::_::
        StaticDisposerAdapter<kj::_::ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,decltype(nullptr)>>>,kj::_::ForkHubBase>
        ::instance;
  fork.hub.ptr = (ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>
                  *)0x0;
  releaseFork.hub.ptr = this_00;
  Own<kj::_::ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>,_std::nullptr_t>
  ::~Own(&releaseFork.hub);
  _Var4 = Promise<int>::wait(&branch1,&waitScope);
  releaseFork.hub.disposer = (Disposer *)CONCAT44(_Var4,0x1c8);
  releaseFork.hub.ptr =
       (ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_> *)
       anon_var_dwarf_4fea7;
  if ((_Var4 != 0x1c8) && (kj::_::Debug::minSeverity < 3)) {
    local_138.disposer = (Disposer *)CONCAT44(local_138.disposer._4_4_,0x1c8);
    local_180 = Promise<int>::wait(&branch1,&waitScope);
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x25e,ERROR,
               "\"failed: expected \" \"(456) == (branch1.wait(waitScope))\", _kjCondition, 456, branch1.wait(waitScope)"
               ,(char (*) [52])"failed: expected (456) == (branch1.wait(waitScope))",
               (DebugComparison<int,_int> *)&releaseFork,(int *)&local_138,
               (int *)&stack0xfffffffffffffe80);
  }
  _Var4 = Promise<int>::wait(&branch2,&waitScope);
  releaseFork.hub.disposer = (Disposer *)CONCAT44(_Var4,0x315);
  releaseFork.hub.ptr =
       (ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_> *)
       anon_var_dwarf_4fea7;
  if ((_Var4 != 0x315) && (kj::_::Debug::minSeverity < 3)) {
    local_138.disposer = (Disposer *)CONCAT44(local_138.disposer._4_4_,0x315);
    local_180 = Promise<int>::wait(&branch2,&waitScope);
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x25f,ERROR,
               "\"failed: expected \" \"(789) == (branch2.wait(waitScope))\", _kjCondition, 789, branch2.wait(waitScope)"
               ,(char (*) [52])"failed: expected (789) == (branch2.wait(waitScope))",
               (DebugComparison<int,_int> *)&releaseFork,(int *)&local_138,
               (int *)&stack0xfffffffffffffe80);
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&branch2);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&branch1);
  Own<kj::_::ForkHub<kj::Maybe<kj::Own<kj::(anonymous_namespace)::RefcountedInt,_std::nullptr_t>_>_>,_std::nullptr_t>
  ::~Own(&fork.hub);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, ForkMaybeRef) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<Maybe<Own<RefcountedInt>>> promise = evalLater([&]() {
    return Maybe<Own<RefcountedInt>>(refcounted<RefcountedInt>(123));
  });

  auto fork = promise.fork();

  auto branch1 = fork.addBranch().then([](Maybe<Own<RefcountedInt>>&& i) {
    EXPECT_EQ(123, KJ_REQUIRE_NONNULL(i)->i);
    return 456;
  });
  auto branch2 = fork.addBranch().then([](Maybe<Own<RefcountedInt>>&& i) {
    EXPECT_EQ(123, KJ_REQUIRE_NONNULL(i)->i);
    return 789;
  });

  {
    auto releaseFork = kj::mv(fork);
  }

  EXPECT_EQ(456, branch1.wait(waitScope));
  EXPECT_EQ(789, branch2.wait(waitScope));
}